

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_ssse3.c
# Opt level: O2

void idct64_low16_ssse3(__m128i *input,__m128i *output)

{
  longlong lVar1;
  longlong extraout_RDX;
  __m128i *cospi;
  int8_t in_R8B;
  undefined4 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  __m128i alVar67;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  __m128i __rounding;
  __m128i __rounding_00;
  __m128i __rounding_01;
  __m128i __rounding_02;
  __m128i __rounding_03;
  __m128i __rounding_04;
  undefined8 local_588;
  undefined8 uStack_580;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_558;
  undefined8 uStack_550;
  undefined8 local_548;
  undefined8 uStack_540;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  undefined8 local_4a8;
  undefined8 uStack_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  __m128i local_438;
  __m128i local_428;
  __m128i local_418;
  __m128i local_408;
  __m128i local_3f8;
  undefined1 local_3e8 [16];
  undefined1 local_3d8 [16];
  undefined1 local_3c8 [16];
  undefined1 local_3b8 [16];
  undefined1 local_3a8 [16];
  undefined1 local_398 [16];
  undefined1 local_388 [16];
  undefined1 local_378 [16];
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [16];
  undefined1 local_338 [16];
  undefined8 local_328;
  undefined8 uStack_320;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [16];
  undefined8 local_298;
  undefined8 uStack_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  longlong extraout_RDX_02;
  longlong extraout_RDX_03;
  longlong extraout_RDX_04;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  
  local_438 = *input;
  local_3f8 = input[8];
  auVar74 = pshuflw(ZEXT416(0x328),ZEXT416(0x328),0);
  uVar2 = auVar74._0_4_;
  auVar80._4_4_ = uVar2;
  auVar80._0_4_ = uVar2;
  auVar80._8_4_ = uVar2;
  auVar80._12_4_ = uVar2;
  auVar74 = pshuflw(ZEXT416(0x7ff8),ZEXT416(0x7ff8),0);
  auVar75._0_4_ = auVar74._0_4_;
  auVar75._4_4_ = auVar75._0_4_;
  auVar75._8_4_ = auVar75._0_4_;
  auVar75._12_4_ = auVar75._0_4_;
  auVar81 = pmulhrsw(auVar80,(undefined1  [16])input[1]);
  auVar76 = pmulhrsw(auVar75,(undefined1  [16])input[1]);
  auVar74 = pshuflw(ZEXT416(0xffffd1f0),ZEXT416(0xffffd1f0),0);
  uVar2 = auVar74._0_4_;
  auVar77._4_4_ = uVar2;
  auVar77._0_4_ = uVar2;
  auVar77._8_4_ = uVar2;
  auVar77._12_4_ = uVar2;
  auVar74 = pshuflw(ZEXT416(0x7770),ZEXT416(0x7770),0);
  auVar69._0_4_ = auVar74._0_4_;
  auVar69._4_4_ = auVar69._0_4_;
  auVar69._8_4_ = auVar69._0_4_;
  auVar69._12_4_ = auVar69._0_4_;
  auVar78 = pmulhrsw(auVar77,(undefined1  [16])input[0xf]);
  auVar70 = pmulhrsw(auVar69,(undefined1  [16])input[0xf]);
  auVar74 = pshuflw(ZEXT416(0x1c08),ZEXT416(0x1c08),0);
  uVar2 = auVar74._0_4_;
  auVar71._4_4_ = uVar2;
  auVar71._0_4_ = uVar2;
  auVar71._8_4_ = uVar2;
  auVar71._12_4_ = uVar2;
  auVar74 = pshuflw(ZEXT416(0x7ce0),ZEXT416(0x7ce0),0);
  auVar64._0_4_ = auVar74._0_4_;
  auVar64._4_4_ = auVar64._0_4_;
  auVar64._8_4_ = auVar64._0_4_;
  auVar64._12_4_ = auVar64._0_4_;
  auVar72 = pmulhrsw(auVar71,(undefined1  [16])input[9]);
  auVar65 = pmulhrsw(auVar64,(undefined1  [16])input[9]);
  auVar74 = pshuflw(ZEXT416(0xffffea20),ZEXT416(0xffffea20),0);
  uVar2 = auVar74._0_4_;
  auVar79._4_4_ = uVar2;
  auVar79._0_4_ = uVar2;
  auVar79._8_4_ = uVar2;
  auVar79._12_4_ = uVar2;
  auVar74 = pshuflw(ZEXT416(0x7e20),ZEXT416(0x7e20),0);
  uVar2 = auVar74._0_4_;
  auVar84._4_4_ = uVar2;
  auVar84._0_4_ = uVar2;
  auVar84._8_4_ = uVar2;
  auVar84._12_4_ = uVar2;
  local_1d8 = pmulhrsw(auVar79,(undefined1  [16])input[7]);
  local_b8 = pmulhrsw(auVar84,(undefined1  [16])input[7]);
  auVar74 = pshuflw(ZEXT416(0xfa8),ZEXT416(0xfa8),0);
  uVar2 = auVar74._0_4_;
  auVar57._4_4_ = uVar2;
  auVar57._0_4_ = uVar2;
  auVar57._8_4_ = uVar2;
  auVar57._12_4_ = uVar2;
  auVar74 = pshuflw(ZEXT416(0x7f08),ZEXT416(0x7f08),0);
  uVar2 = auVar74._0_4_;
  auVar83._4_4_ = uVar2;
  auVar83._0_4_ = uVar2;
  auVar83._8_4_ = uVar2;
  auVar83._12_4_ = uVar2;
  local_1b8 = pmulhrsw(auVar57,(undefined1  [16])input[5]);
  local_d8 = pmulhrsw(auVar83,(undefined1  [16])input[5]);
  auVar74 = pshuflw(ZEXT416(0xffffdde0),ZEXT416(0xffffdde0),0);
  uVar2 = auVar74._0_4_;
  auVar47._4_4_ = uVar2;
  auVar47._0_4_ = uVar2;
  auVar47._8_4_ = uVar2;
  auVar47._12_4_ = uVar2;
  auVar74 = pshuflw(ZEXT416(0x7b60),ZEXT416(0x7b60),0);
  auVar24._0_4_ = auVar74._0_4_;
  auVar24._4_4_ = auVar24._0_4_;
  auVar24._8_4_ = auVar24._0_4_;
  auVar24._12_4_ = auVar24._0_4_;
  local_198 = pmulhrsw(auVar47,(undefined1  [16])input[0xb]);
  auVar25 = pmulhrsw(auVar24,(undefined1  [16])input[0xb]);
  auVar74 = pshuflw(ZEXT416(0x2828),ZEXT416(0x2828),0);
  uVar2 = auVar74._0_4_;
  auVar26._4_4_ = uVar2;
  auVar26._0_4_ = uVar2;
  auVar26._8_4_ = uVar2;
  auVar26._12_4_ = uVar2;
  auVar74 = pshuflw(ZEXT416(0x7988),ZEXT416(0x7988),0);
  auVar3._0_4_ = auVar74._0_4_;
  auVar3._4_4_ = auVar3._0_4_;
  auVar3._8_4_ = auVar3._0_4_;
  auVar3._12_4_ = auVar3._0_4_;
  auVar27 = pmulhrsw(auVar26,(undefined1  [16])input[0xd]);
  auVar4 = pmulhrsw(auVar3,(undefined1  [16])input[0xd]);
  auVar74 = pshuflw(ZEXT416(0xfffff698),ZEXT416(0xfffff698),0);
  uVar2 = auVar74._0_4_;
  auVar5._4_4_ = uVar2;
  auVar5._0_4_ = uVar2;
  auVar5._8_4_ = uVar2;
  auVar5._12_4_ = uVar2;
  auVar74 = pshuflw(ZEXT416(0x7fa8),ZEXT416(0x7fa8),0);
  uVar2 = auVar74._0_4_;
  auVar28._4_4_ = uVar2;
  auVar28._0_4_ = uVar2;
  auVar28._8_4_ = uVar2;
  auVar28._12_4_ = uVar2;
  auVar6 = pmulhrsw(auVar5,(undefined1  [16])input[3]);
  auVar29 = pmulhrsw(auVar28,(undefined1  [16])input[3]);
  auVar74 = pshuflw(ZEXT416(0x648),ZEXT416(0x648),0);
  uVar2 = auVar74._0_4_;
  auVar30._4_4_ = uVar2;
  auVar30._0_4_ = uVar2;
  auVar30._8_4_ = uVar2;
  auVar30._12_4_ = uVar2;
  auVar74 = pshuflw(ZEXT416(0x7fd8),ZEXT416(0x7fd8),0);
  uVar2 = auVar74._0_4_;
  auVar7._4_4_ = uVar2;
  auVar7._0_4_ = uVar2;
  auVar7._8_4_ = uVar2;
  auVar7._12_4_ = uVar2;
  local_338 = pmulhrsw(auVar30,(undefined1  [16])input[2]);
  auVar8 = pmulhrsw(auVar7,(undefined1  [16])input[2]);
  auVar74 = pshuflw(ZEXT416(0xffffd4e0),ZEXT416(0xffffd4e0),0);
  uVar2 = auVar74._0_4_;
  auVar9._4_4_ = uVar2;
  auVar9._0_4_ = uVar2;
  auVar9._8_4_ = uVar2;
  auVar9._12_4_ = uVar2;
  auVar74 = pshuflw(ZEXT416(0x7888),ZEXT416(0x7888),0);
  uVar2 = auVar74._0_4_;
  auVar31._4_4_ = uVar2;
  auVar31._0_4_ = uVar2;
  auVar31._8_4_ = uVar2;
  auVar31._12_4_ = uVar2;
  auVar10 = pmulhrsw(auVar9,(undefined1  [16])input[0xe]);
  auVar32 = pmulhrsw(auVar31,(undefined1  [16])input[0xe]);
  auVar74 = pshuflw(ZEXT416(0x1f18),ZEXT416(0x1f18),0);
  uVar2 = auVar74._0_4_;
  auVar11._4_4_ = uVar2;
  auVar11._0_4_ = uVar2;
  auVar11._8_4_ = uVar2;
  auVar11._12_4_ = uVar2;
  auVar74 = pshuflw(ZEXT416(0x7c28),ZEXT416(0x7c28),0);
  uVar2 = auVar74._0_4_;
  auVar33._4_4_ = uVar2;
  auVar33._0_4_ = uVar2;
  auVar33._8_4_ = uVar2;
  auVar33._12_4_ = uVar2;
  auVar12 = pmulhrsw(auVar11,(undefined1  [16])input[10]);
  auVar34 = pmulhrsw(auVar33,(undefined1  [16])input[10]);
  auVar74 = pshuflw(ZEXT416(0xffffed38),ZEXT416(0xffffed38),0);
  uVar2 = auVar74._0_4_;
  auVar13._4_4_ = uVar2;
  auVar13._0_4_ = uVar2;
  auVar13._8_4_ = uVar2;
  auVar13._12_4_ = uVar2;
  auVar74 = pshuflw(ZEXT416(0x7ea0),ZEXT416(0x7ea0),0);
  uVar2 = auVar74._0_4_;
  auVar82._4_4_ = uVar2;
  auVar82._0_4_ = uVar2;
  auVar82._8_4_ = uVar2;
  auVar82._12_4_ = uVar2;
  auVar74 = pmulhrsw(auVar13,(undefined1  [16])input[6]);
  local_2b8 = pmulhrsw(auVar82,(undefined1  [16])input[6]);
  local_448 = auVar81._0_8_;
  uStack_440 = auVar81._8_8_;
  local_238 = local_448;
  uStack_230 = uStack_440;
  local_578 = auVar76._0_8_;
  uStack_570 = auVar76._8_8_;
  local_48 = local_578;
  uStack_40 = uStack_570;
  local_458 = auVar78._0_8_;
  uStack_450 = auVar78._8_8_;
  local_208 = local_458;
  uStack_200 = uStack_450;
  local_588 = auVar70._0_8_;
  uStack_580 = auVar70._8_8_;
  local_78 = local_588;
  uStack_70 = uStack_580;
  local_468 = auVar72._0_8_;
  uStack_460 = auVar72._8_8_;
  local_1f8 = local_468;
  uStack_1f0 = uStack_460;
  local_478 = auVar65._0_8_;
  uStack_470 = auVar65._8_8_;
  local_88 = local_478;
  uStack_80 = uStack_470;
  local_488 = auVar25._0_8_;
  uStack_480 = auVar25._8_8_;
  local_f8 = local_488;
  uStack_f0 = uStack_480;
  local_498 = auVar27._0_8_;
  uStack_490 = auVar27._8_8_;
  local_178 = local_498;
  uStack_170 = uStack_490;
  local_4a8 = auVar4._0_8_;
  uStack_4a0 = auVar4._8_8_;
  local_108 = local_4a8;
  uStack_100 = uStack_4a0;
  local_4b8 = auVar6._0_8_;
  uStack_4b0 = auVar6._8_8_;
  local_148 = local_4b8;
  uStack_140 = uStack_4b0;
  local_4c8 = auVar29._0_8_;
  uStack_4c0 = auVar29._8_8_;
  local_138 = local_4c8;
  uStack_130 = uStack_4c0;
  local_518 = auVar8._0_8_;
  uStack_510 = auVar8._8_8_;
  local_248 = local_518;
  uStack_240 = uStack_510;
  local_538 = auVar10._0_8_;
  uStack_530 = auVar10._8_8_;
  local_308 = local_538;
  uStack_300 = uStack_530;
  local_528 = auVar32._0_8_;
  uStack_520 = auVar32._8_8_;
  local_278 = local_528;
  uStack_270 = uStack_520;
  local_558 = auVar12._0_8_;
  uStack_550 = auVar12._8_8_;
  local_2f8 = local_558;
  uStack_2f0 = uStack_550;
  local_548 = auVar34._0_8_;
  uStack_540 = auVar34._8_8_;
  local_288 = local_548;
  uStack_280 = uStack_540;
  local_508 = auVar74._0_8_;
  uStack_500 = auVar74._8_8_;
  local_2c8 = local_508;
  uStack_2c0 = uStack_500;
  local_228 = local_448;
  uStack_220 = uStack_440;
  local_218 = local_458;
  uStack_210 = uStack_450;
  local_1e8 = local_468;
  uStack_1e0 = uStack_460;
  local_168 = local_498;
  uStack_160 = uStack_490;
  local_158 = local_4b8;
  uStack_150 = uStack_4b0;
  local_128 = local_4c8;
  uStack_120 = uStack_4c0;
  local_118 = local_4a8;
  uStack_110 = uStack_4a0;
  local_e8 = local_488;
  uStack_e0 = uStack_480;
  local_98 = local_478;
  uStack_90 = uStack_470;
  local_68 = local_588;
  uStack_60 = uStack_580;
  local_58 = local_578;
  uStack_50 = uStack_570;
  auVar74 = pshuflw(ZEXT416(0xc88),ZEXT416(0xc88),0);
  auVar58._0_4_ = auVar74._0_4_;
  auVar58._4_4_ = auVar58._0_4_;
  auVar58._8_4_ = auVar58._0_4_;
  auVar58._12_4_ = auVar58._0_4_;
  local_3b8 = pmulhrsw(auVar58,(undefined1  [16])input[4]);
  auVar74 = pshuflw(ZEXT416(0x7f60),ZEXT416(0x7f60),0);
  auVar59._0_4_ = auVar74._0_4_;
  auVar59._4_4_ = auVar59._0_4_;
  auVar59._8_4_ = auVar59._0_4_;
  auVar59._12_4_ = auVar59._0_4_;
  local_348 = pmulhrsw(auVar59,(undefined1  [16])input[4]);
  auVar74 = pshuflw(ZEXT416(0xffffdad8),ZEXT416(0xffffdad8),0);
  auVar35._0_4_ = auVar74._0_4_;
  auVar35._4_4_ = auVar35._0_4_;
  auVar35._8_4_ = auVar35._0_4_;
  auVar35._12_4_ = auVar35._0_4_;
  local_388 = pmulhrsw(auVar35,(undefined1  [16])input[0xc]);
  auVar74 = pshuflw(ZEXT416(0x7a80),ZEXT416(0x7a80),0);
  auVar36._0_4_ = auVar74._0_4_;
  auVar36._4_4_ = auVar36._0_4_;
  auVar36._8_4_ = auVar36._0_4_;
  auVar36._12_4_ = auVar36._0_4_;
  local_378 = pmulhrsw(auVar36,(undefined1  [16])input[0xc]);
  local_4e8 = local_338._0_8_;
  uStack_4e0 = local_338._8_8_;
  local_328 = local_4e8;
  uStack_320 = uStack_4e0;
  local_318 = local_538;
  uStack_310 = uStack_530;
  local_2e8 = local_558;
  uStack_2e0 = uStack_550;
  local_2d8 = local_508;
  uStack_2d0 = uStack_500;
  local_298 = local_548;
  uStack_290 = uStack_540;
  local_268 = local_528;
  uStack_260 = uStack_520;
  local_258 = local_518;
  uStack_250 = uStack_510;
  alVar67[1]._0_4_ = 0xf4b0;
  alVar67[0] = 0xf138;
  alVar67[1]._4_4_ = 0;
  lVar1 = 0xf4b0;
  cospi = output;
  local_2a8 = local_2b8;
  local_1c8 = local_1d8;
  local_1a8 = local_1b8;
  local_188 = local_198;
  local_c8 = local_d8;
  local_a8 = local_b8;
  idct64_stage4_high32_sse2(&local_438,(int32_t *)output,alVar67,in_R8B);
  auVar74 = pshuflw(ZEXT416(0x18f8),ZEXT416(0x18f8),0);
  auVar74._4_4_ = auVar74._0_4_;
  auVar74._8_4_ = auVar74._0_4_;
  auVar74._12_4_ = auVar74._0_4_;
  auVar4 = pshuflw(ZEXT416(0x7d88),ZEXT416(0x7d88),0);
  auVar81._0_4_ = auVar4._0_4_;
  auVar81._4_4_ = auVar81._0_4_;
  auVar81._8_4_ = auVar81._0_4_;
  auVar81._12_4_ = auVar81._0_4_;
  auVar74 = pmulhrsw(auVar74,(undefined1  [16])local_3f8);
  local_3c8 = pmulhrsw(auVar81,(undefined1  [16])local_3f8);
  local_3a8 = local_3b8;
  local_398 = local_388;
  local_368 = local_378;
  local_358 = local_348;
  __rounding[1] = lVar1;
  __rounding[0] = extraout_RDX;
  local_3f8 = (__m128i)auVar74;
  idct64_stage5_high48_sse2(&local_438,(int32_t *)cospi,__rounding,in_R8B);
  auVar74 = pshuflw(ZEXT416(0x5a80),ZEXT416(0x5a80),0);
  auVar4._0_4_ = auVar74._0_4_;
  auVar4._4_4_ = auVar4._0_4_;
  auVar4._8_4_ = auVar4._0_4_;
  auVar4._12_4_ = auVar4._0_4_;
  local_438 = (__m128i)pmulhrsw(auVar4,(undefined1  [16])local_438);
  local_3e8._0_8_ = local_3f8[0];
  local_3e8._8_8_ = local_3f8[1];
  local_3d8 = local_3c8;
  auVar51._0_12_ = local_3a8._0_12_;
  auVar51._12_2_ = local_3a8._6_2_;
  auVar51._14_2_ = local_358._6_2_;
  auVar50._12_4_ = auVar51._12_4_;
  auVar50._0_10_ = local_3a8._0_10_;
  auVar50._10_2_ = local_358._4_2_;
  auVar49._10_6_ = auVar50._10_6_;
  auVar49._0_8_ = local_3a8._0_8_;
  auVar49._8_2_ = local_3a8._4_2_;
  auVar48._8_8_ = auVar49._8_8_;
  auVar48._6_2_ = local_358._2_2_;
  auVar48._4_2_ = local_3a8._2_2_;
  auVar48._0_2_ = local_3a8._0_2_;
  auVar48._2_2_ = local_358._0_2_;
  auVar37._2_2_ = local_358._8_2_;
  auVar37._0_2_ = local_3a8._8_2_;
  auVar37._4_2_ = local_3a8._10_2_;
  auVar37._6_2_ = local_358._10_2_;
  auVar37._8_2_ = local_3a8._12_2_;
  auVar37._10_2_ = local_358._12_2_;
  auVar37._12_2_ = local_3a8._14_2_;
  auVar37._14_2_ = local_358._14_2_;
  auVar14._8_4_ = 0x61ff138;
  auVar14._0_8_ = 0x61ff138061ff138;
  auVar14._12_4_ = 0x61ff138;
  auVar6 = pmaddwd(auVar48,auVar14);
  auVar8 = pmaddwd(auVar37,auVar14);
  auVar73._8_4_ = 0xec8061f;
  auVar73._0_8_ = 0xec8061f0ec8061f;
  auVar73._12_4_ = 0xec8061f;
  auVar4 = pmaddwd(auVar48,auVar73);
  auVar74 = pmaddwd(auVar37,auVar73);
  auVar60._0_4_ = auVar6._0_4_ + 0x800 >> 0xc;
  auVar60._4_4_ = auVar6._4_4_ + 0x800 >> 0xc;
  auVar60._8_4_ = auVar6._8_4_ + 0x800 >> 0xc;
  auVar60._12_4_ = auVar6._12_4_ + 0x800 >> 0xc;
  auVar66._0_4_ = auVar8._0_4_ + 0x800 >> 0xc;
  auVar66._4_4_ = auVar8._4_4_ + 0x800 >> 0xc;
  auVar66._8_4_ = auVar8._8_4_ + 0x800 >> 0xc;
  auVar66._12_4_ = auVar8._12_4_ + 0x800 >> 0xc;
  local_3a8 = packssdw(auVar60,auVar66);
  auVar52._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar52._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar52._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar52._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar38._0_4_ = auVar74._0_4_ + 0x800 >> 0xc;
  auVar38._4_4_ = auVar74._4_4_ + 0x800 >> 0xc;
  auVar38._8_4_ = auVar74._8_4_ + 0x800 >> 0xc;
  auVar38._12_4_ = auVar74._12_4_ + 0x800 >> 0xc;
  local_358 = packssdw(auVar52,auVar38);
  auVar42._0_12_ = local_398._0_12_;
  auVar42._12_2_ = local_398._6_2_;
  auVar42._14_2_ = local_368._6_2_;
  auVar41._12_4_ = auVar42._12_4_;
  auVar41._0_10_ = local_398._0_10_;
  auVar41._10_2_ = local_368._4_2_;
  auVar40._10_6_ = auVar41._10_6_;
  auVar40._0_8_ = local_398._0_8_;
  auVar40._8_2_ = local_398._4_2_;
  auVar39._8_8_ = auVar40._8_8_;
  auVar39._6_2_ = local_368._2_2_;
  auVar39._4_2_ = local_398._2_2_;
  auVar39._0_2_ = local_398._0_2_;
  auVar39._2_2_ = local_368._0_2_;
  auVar6._2_2_ = local_368._8_2_;
  auVar6._0_2_ = local_398._8_2_;
  auVar6._4_2_ = local_398._10_2_;
  auVar6._6_2_ = local_368._10_2_;
  auVar6._8_2_ = local_398._12_2_;
  auVar6._10_2_ = local_368._12_2_;
  auVar6._12_2_ = local_398._14_2_;
  auVar6._14_2_ = local_368._14_2_;
  auVar53._8_4_ = 0xf138f9e1;
  auVar53._0_8_ = 0xf138f9e1f138f9e1;
  auVar53._12_4_ = 0xf138f9e1;
  auVar10 = pmaddwd(auVar39,auVar53);
  auVar8 = pmaddwd(auVar53,auVar6);
  auVar4 = pmaddwd(auVar39,auVar14);
  auVar74 = pmaddwd(auVar6,auVar14);
  auVar61._0_4_ = auVar10._0_4_ + 0x800 >> 0xc;
  auVar61._4_4_ = auVar10._4_4_ + 0x800 >> 0xc;
  auVar61._8_4_ = auVar10._8_4_ + 0x800 >> 0xc;
  auVar61._12_4_ = auVar10._12_4_ + 0x800 >> 0xc;
  auVar54._0_4_ = auVar8._0_4_ + 0x800 >> 0xc;
  auVar54._4_4_ = auVar8._4_4_ + 0x800 >> 0xc;
  auVar54._8_4_ = auVar8._8_4_ + 0x800 >> 0xc;
  auVar54._12_4_ = auVar8._12_4_ + 0x800 >> 0xc;
  local_398 = packssdw(auVar61,auVar54);
  auVar43._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar43._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar43._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar43._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar8._0_4_ = auVar74._0_4_ + 0x800 >> 0xc;
  auVar8._4_4_ = auVar74._4_4_ + 0x800 >> 0xc;
  auVar8._8_4_ = auVar74._8_4_ + 0x800 >> 0xc;
  auVar8._12_4_ = auVar74._12_4_ + 0x800 >> 0xc;
  local_368 = packssdw(auVar43,auVar8);
  __rounding_00[1] = lVar1;
  __rounding_00[0] = extraout_RDX_00;
  local_428 = local_438;
  idct64_stage6_high48_sse2(&local_438,(int32_t *)cospi,__rounding_00,in_R8B);
  local_408[0] = local_438[0];
  local_408[1] = local_438[1];
  local_418[0] = local_428[0];
  local_418[1] = local_428[1];
  auVar18._0_12_ = local_3e8._0_12_;
  auVar18._12_2_ = local_3e8._6_2_;
  auVar18._14_2_ = local_3d8._6_2_;
  auVar17._12_4_ = auVar18._12_4_;
  auVar17._0_10_ = local_3e8._0_10_;
  auVar17._10_2_ = local_3d8._4_2_;
  auVar16._10_6_ = auVar17._10_6_;
  auVar16._0_8_ = local_3e8._0_8_;
  auVar16._8_2_ = local_3e8._4_2_;
  auVar15._8_8_ = auVar16._8_8_;
  auVar15._6_2_ = local_3d8._2_2_;
  auVar15._4_2_ = local_3e8._2_2_;
  auVar15._0_2_ = local_3e8._0_2_;
  auVar15._2_2_ = local_3d8._0_2_;
  auVar10._2_2_ = local_3d8._8_2_;
  auVar10._0_2_ = local_3e8._8_2_;
  auVar10._4_2_ = local_3e8._10_2_;
  auVar10._6_2_ = local_3d8._10_2_;
  auVar10._8_2_ = local_3e8._12_2_;
  auVar10._10_2_ = local_3d8._12_2_;
  auVar10._12_2_ = local_3e8._14_2_;
  auVar10._14_2_ = local_3d8._14_2_;
  auVar62._8_4_ = 0xb50f4b0;
  auVar62._0_8_ = 0xb50f4b00b50f4b0;
  auVar62._12_4_ = 0xb50f4b0;
  auVar6 = pmaddwd(auVar15,auVar62);
  auVar8 = pmaddwd(auVar10,auVar62);
  auVar63._8_4_ = 0xb500b50;
  auVar63._0_8_ = 0xb500b500b500b50;
  auVar63._12_4_ = 0xb500b50;
  auVar4 = pmaddwd(auVar15,auVar63);
  auVar74 = pmaddwd(auVar10,auVar63);
  auVar44._0_4_ = auVar6._0_4_ + 0x800 >> 0xc;
  auVar44._4_4_ = auVar6._4_4_ + 0x800 >> 0xc;
  auVar44._8_4_ = auVar6._8_4_ + 0x800 >> 0xc;
  auVar44._12_4_ = auVar6._12_4_ + 0x800 >> 0xc;
  auVar55._0_4_ = auVar8._0_4_ + 0x800 >> 0xc;
  auVar55._4_4_ = auVar8._4_4_ + 0x800 >> 0xc;
  auVar55._8_4_ = auVar8._8_4_ + 0x800 >> 0xc;
  auVar55._12_4_ = auVar8._12_4_ + 0x800 >> 0xc;
  local_3e8 = packssdw(auVar44,auVar55);
  auVar19._0_4_ = auVar4._0_4_ + 0x800 >> 0xc;
  auVar19._4_4_ = auVar4._4_4_ + 0x800 >> 0xc;
  auVar19._8_4_ = auVar4._8_4_ + 0x800 >> 0xc;
  auVar19._12_4_ = auVar4._12_4_ + 0x800 >> 0xc;
  auVar12._0_4_ = auVar74._0_4_ + 0x800 >> 0xc;
  auVar12._4_4_ = auVar74._4_4_ + 0x800 >> 0xc;
  auVar12._8_4_ = auVar74._8_4_ + 0x800 >> 0xc;
  auVar12._12_4_ = auVar74._12_4_ + 0x800 >> 0xc;
  local_3d8 = packssdw(auVar19,auVar12);
  auVar74 = paddsw(local_3b8,local_388);
  local_388 = psubsw(local_3b8,local_388);
  auVar4 = paddsw(local_3a8,local_398);
  local_398 = psubsw(local_3a8,local_398);
  auVar6 = psubsw(local_348,local_378);
  local_348 = paddsw(local_348,local_378);
  auVar8 = psubsw(local_358,local_368);
  local_358 = paddsw(local_358,local_368);
  __rounding_01[1] = lVar1;
  __rounding_01[0] = extraout_RDX_01;
  local_3b8 = auVar74;
  local_3a8 = auVar4;
  local_378 = auVar6;
  local_368 = auVar8;
  idct64_stage7_high48_sse2(&local_438,(int32_t *)cospi,__rounding_01,in_R8B);
  alVar67 = (__m128i)paddsw((undefined1  [16])local_438,local_3c8);
  local_3c8 = psubsw((undefined1  [16])local_438,local_3c8);
  auVar4 = paddsw((undefined1  [16])local_428,local_3d8);
  local_3d8 = psubsw((undefined1  [16])local_428,local_3d8);
  auVar6 = paddsw((undefined1  [16])local_418,local_3e8);
  local_3e8 = psubsw((undefined1  [16])local_418,local_3e8);
  auVar8 = paddsw((undefined1  [16])local_408,(undefined1  [16])local_3f8);
  local_3f8 = (__m128i)psubsw((undefined1  [16])local_408,(undefined1  [16])local_3f8);
  auVar27._0_12_ = local_398._0_12_;
  auVar27._12_2_ = local_398._6_2_;
  auVar27._14_2_ = local_368._6_2_;
  auVar25._12_4_ = auVar27._12_4_;
  auVar25._0_10_ = local_398._0_10_;
  auVar25._10_2_ = local_368._4_2_;
  auVar29._10_6_ = auVar25._10_6_;
  auVar29._0_8_ = local_398._0_8_;
  auVar29._8_2_ = local_398._4_2_;
  auVar32._8_8_ = auVar29._8_8_;
  auVar32._6_2_ = local_368._2_2_;
  auVar32._4_2_ = local_398._2_2_;
  auVar32._0_2_ = local_398._0_2_;
  auVar32._2_2_ = local_368._0_2_;
  auVar20._2_2_ = local_368._8_2_;
  auVar20._0_2_ = local_398._8_2_;
  auVar20._4_2_ = local_398._10_2_;
  auVar20._6_2_ = local_368._10_2_;
  auVar20._8_2_ = local_398._12_2_;
  auVar20._10_2_ = local_368._12_2_;
  auVar20._12_2_ = local_398._14_2_;
  auVar20._14_2_ = local_368._14_2_;
  auVar12 = pmaddwd(auVar32,auVar62);
  auVar25 = pmaddwd(auVar20,auVar62);
  auVar74 = pmaddwd(auVar32,auVar63);
  auVar10 = pmaddwd(auVar20,auVar63);
  auVar45._0_4_ = auVar12._0_4_ + 0x800 >> 0xc;
  auVar45._4_4_ = auVar12._4_4_ + 0x800 >> 0xc;
  auVar45._8_4_ = auVar12._8_4_ + 0x800 >> 0xc;
  auVar45._12_4_ = auVar12._12_4_ + 0x800 >> 0xc;
  auVar56._0_4_ = auVar25._0_4_ + 0x800 >> 0xc;
  auVar56._4_4_ = auVar25._4_4_ + 0x800 >> 0xc;
  auVar56._8_4_ = auVar25._8_4_ + 0x800 >> 0xc;
  auVar56._12_4_ = auVar25._12_4_ + 0x800 >> 0xc;
  local_398 = packssdw(auVar45,auVar56);
  auVar34._0_4_ = auVar74._0_4_ + 0x800 >> 0xc;
  auVar34._4_4_ = auVar74._4_4_ + 0x800 >> 0xc;
  auVar34._8_4_ = auVar74._8_4_ + 0x800 >> 0xc;
  auVar34._12_4_ = auVar74._12_4_ + 0x800 >> 0xc;
  auVar21._0_4_ = auVar10._0_4_ + 0x800 >> 0xc;
  auVar21._4_4_ = auVar10._4_4_ + 0x800 >> 0xc;
  auVar21._8_4_ = auVar10._8_4_ + 0x800 >> 0xc;
  auVar21._12_4_ = auVar10._12_4_ + 0x800 >> 0xc;
  local_368 = packssdw(auVar34,auVar21);
  auVar76._0_12_ = local_388._0_12_;
  auVar76._12_2_ = local_388._6_2_;
  auVar76._14_2_ = local_378._6_2_;
  auVar72._12_4_ = auVar76._12_4_;
  auVar72._0_10_ = local_388._0_10_;
  auVar72._10_2_ = local_378._4_2_;
  auVar70._10_6_ = auVar72._10_6_;
  auVar70._0_8_ = local_388._0_8_;
  auVar70._8_2_ = local_388._4_2_;
  auVar65._8_8_ = auVar70._8_8_;
  auVar65._6_2_ = local_378._2_2_;
  auVar65._4_2_ = local_388._2_2_;
  auVar65._0_2_ = local_388._0_2_;
  auVar65._2_2_ = local_378._0_2_;
  auVar22._2_2_ = local_378._8_2_;
  auVar22._0_2_ = local_388._8_2_;
  auVar22._4_2_ = local_388._10_2_;
  auVar22._6_2_ = local_378._10_2_;
  auVar22._8_2_ = local_388._12_2_;
  auVar22._10_2_ = local_378._12_2_;
  auVar22._12_2_ = local_388._14_2_;
  auVar22._14_2_ = local_378._14_2_;
  auVar12 = pmaddwd(auVar65,auVar62);
  auVar25 = pmaddwd(auVar62,auVar22);
  auVar74 = pmaddwd(auVar65,auVar63);
  auVar10 = pmaddwd(auVar22,auVar63);
  auVar46._0_4_ = auVar12._0_4_ + 0x800 >> 0xc;
  auVar46._4_4_ = auVar12._4_4_ + 0x800 >> 0xc;
  auVar46._8_4_ = auVar12._8_4_ + 0x800 >> 0xc;
  auVar46._12_4_ = auVar12._12_4_ + 0x800 >> 0xc;
  auVar68._0_4_ = auVar25._0_4_ + 0x800 >> 0xc;
  auVar68._4_4_ = auVar25._4_4_ + 0x800 >> 0xc;
  auVar68._8_4_ = auVar25._8_4_ + 0x800 >> 0xc;
  auVar68._12_4_ = auVar25._12_4_ + 0x800 >> 0xc;
  local_388 = packssdw(auVar46,auVar68);
  auVar78._0_4_ = auVar74._0_4_ + 0x800 >> 0xc;
  auVar78._4_4_ = auVar74._4_4_ + 0x800 >> 0xc;
  auVar78._8_4_ = auVar74._8_4_ + 0x800 >> 0xc;
  auVar78._12_4_ = auVar74._12_4_ + 0x800 >> 0xc;
  auVar23._0_4_ = auVar10._0_4_ + 0x800 >> 0xc;
  auVar23._4_4_ = auVar10._4_4_ + 0x800 >> 0xc;
  auVar23._8_4_ = auVar10._8_4_ + 0x800 >> 0xc;
  auVar23._12_4_ = auVar10._12_4_ + 0x800 >> 0xc;
  local_378 = packssdw(auVar78,auVar23);
  __rounding_02[1] = lVar1;
  __rounding_02[0] = extraout_RDX_02;
  local_438 = alVar67;
  local_428 = (__m128i)auVar4;
  local_418 = (__m128i)auVar6;
  local_408 = (__m128i)auVar8;
  idct64_stage8_high48_sse2(&local_438,(int32_t *)cospi,__rounding_02,in_R8B);
  __rounding_03[1] = lVar1;
  __rounding_03[0] = extraout_RDX_03;
  idct64_stage9_sse2(&local_438,(int32_t *)cospi,__rounding_03,in_R8B);
  __rounding_04[1] = lVar1;
  __rounding_04[0] = extraout_RDX_04;
  idct64_stage10_sse2(&local_438,(int32_t *)cospi,__rounding_04,in_R8B);
  idct64_stage11_sse2(output,&local_438);
  return;
}

Assistant:

static void idct64_low16_ssse3(const __m128i *input, __m128i *output) {
  const int8_t cos_bit = INV_COS_BIT;
  const int32_t *cospi = cospi_arr(INV_COS_BIT);
  const __m128i __rounding = _mm_set1_epi32(1 << (INV_COS_BIT - 1));

  const __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  const __m128i cospi_m16_p48 = pair_set_epi16(-cospi[16], cospi[48]);
  const __m128i cospi_p48_p16 = pair_set_epi16(cospi[48], cospi[16]);
  const __m128i cospi_m48_m16 = pair_set_epi16(-cospi[48], -cospi[16]);
  const __m128i cospi_m32_p32 = pair_set_epi16(-cospi[32], cospi[32]);

  // stage 1
  __m128i x[64];
  x[0] = input[0];
  x[4] = input[8];
  x[8] = input[4];
  x[12] = input[12];
  x[16] = input[2];
  x[20] = input[10];
  x[24] = input[6];
  x[28] = input[14];
  x[32] = input[1];
  x[36] = input[9];
  x[40] = input[5];
  x[44] = input[13];
  x[48] = input[3];
  x[52] = input[11];
  x[56] = input[7];
  x[60] = input[15];

  // stage 2
  btf_16_ssse3(cospi[63], cospi[1], x[32], x[32], x[63]);
  btf_16_ssse3(-cospi[49], cospi[15], x[60], x[35], x[60]);
  btf_16_ssse3(cospi[55], cospi[9], x[36], x[36], x[59]);
  btf_16_ssse3(-cospi[57], cospi[7], x[56], x[39], x[56]);
  btf_16_ssse3(cospi[59], cospi[5], x[40], x[40], x[55]);
  btf_16_ssse3(-cospi[53], cospi[11], x[52], x[43], x[52]);
  btf_16_ssse3(cospi[51], cospi[13], x[44], x[44], x[51]);
  btf_16_ssse3(-cospi[61], cospi[3], x[48], x[47], x[48]);

  // stage 3
  btf_16_ssse3(cospi[62], cospi[2], x[16], x[16], x[31]);
  btf_16_ssse3(-cospi[50], cospi[14], x[28], x[19], x[28]);
  btf_16_ssse3(cospi[54], cospi[10], x[20], x[20], x[27]);
  btf_16_ssse3(-cospi[58], cospi[6], x[24], x[23], x[24]);
  x[33] = x[32];
  x[34] = x[35];
  x[37] = x[36];
  x[38] = x[39];
  x[41] = x[40];
  x[42] = x[43];
  x[45] = x[44];
  x[46] = x[47];
  x[49] = x[48];
  x[50] = x[51];
  x[53] = x[52];
  x[54] = x[55];
  x[57] = x[56];
  x[58] = x[59];
  x[61] = x[60];
  x[62] = x[63];

  // stage 4
  btf_16_ssse3(cospi[60], cospi[4], x[8], x[8], x[15]);
  btf_16_ssse3(-cospi[52], cospi[12], x[12], x[11], x[12]);
  x[17] = x[16];
  x[18] = x[19];
  x[21] = x[20];
  x[22] = x[23];
  x[25] = x[24];
  x[26] = x[27];
  x[29] = x[28];
  x[30] = x[31];
  idct64_stage4_high32_sse2(x, cospi, __rounding, cos_bit);

  // stage 5
  btf_16_ssse3(cospi[56], cospi[8], x[4], x[4], x[7]);
  x[9] = x[8];
  x[10] = x[11];
  x[13] = x[12];
  x[14] = x[15];
  idct64_stage5_high48_sse2(x, cospi, __rounding, cos_bit);

  // stage 6
  btf_16_ssse3(cospi[32], cospi[32], x[0], x[0], x[1]);
  x[5] = x[4];
  x[6] = x[7];
  btf_16_sse2(cospi_m16_p48, cospi_p48_p16, x[9], x[14], x[9], x[14]);
  btf_16_sse2(cospi_m48_m16, cospi_m16_p48, x[10], x[13], x[10], x[13]);
  idct64_stage6_high48_sse2(x, cospi, __rounding, cos_bit);

  // stage 7
  x[3] = x[0];
  x[2] = x[1];
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[5], x[6], x[5], x[6]);
  btf_16_adds_subs_sse2(x[8], x[11]);
  btf_16_adds_subs_sse2(x[9], x[10]);
  btf_16_subs_adds_sse2(x[15], x[12]);
  btf_16_subs_adds_sse2(x[14], x[13]);
  idct64_stage7_high48_sse2(x, cospi, __rounding, cos_bit);

  // stage 8
  btf_16_adds_subs_sse2(x[0], x[7]);
  btf_16_adds_subs_sse2(x[1], x[6]);
  btf_16_adds_subs_sse2(x[2], x[5]);
  btf_16_adds_subs_sse2(x[3], x[4]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[10], x[13], x[10], x[13]);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, x[11], x[12], x[11], x[12]);
  idct64_stage8_high48_sse2(x, cospi, __rounding, cos_bit);

  idct64_stage9_sse2(x, cospi, __rounding, cos_bit);
  idct64_stage10_sse2(x, cospi, __rounding, cos_bit);
  idct64_stage11_sse2(output, x);
}